

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O1

void __thiscall
LatencyCollector::addLatency(LatencyCollector *this,string *lat_name,uint64_t lat_value)

{
  atomic<unsigned_long> *paVar1;
  HistBin *pHVar2;
  long *plVar3;
  bool bVar4;
  ulong uVar5;
  iterator iVar6;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  LatencyItem *pLVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  MapWrapperSP expected;
  MapWrapperSP new_map;
  ashared_ptr<MapWrapper> local_f8;
  ashared_ptr<MapWrapper> local_c8;
  ashared_ptr<MapWrapper> local_98;
  ashared_ptr<MapWrapper> local_60;
  
  if (lat_value == 0) {
    uVar5 = 0x40;
  }
  else {
    uVar5 = 0x3f;
    if (lat_value != 0) {
      for (; lat_value >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  local_c8.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8.lock.super___mutex_base._M_mutex._8_8_ = 0;
  local_c8.lock.super___mutex_base._M_mutex._16_8_ = 0;
  local_c8.object._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_c8.lock.super___mutex_base._M_mutex.__align = 0;
  lVar9 = 0x10;
  while( true ) {
    ashared_ptr<MapWrapper>::operator=(&local_c8,&this->latestMap);
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(*(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     **)local_c8.object._M_b._M_p,lat_name);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = *(long *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
                              ._M_cur + 0x28);
    }
    if (lVar8 != 0) break;
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)operator_new(0x38);
    this_00->_M_buckets = &this_00->_M_single_bucket;
    this_00->_M_bucket_count = 1;
    (this_00->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
    this_00->_M_element_count = 0;
    (this_00->_M_rehash_policy)._M_max_load_factor = 1.0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_single_bucket = (__node_base_ptr)0x0;
    if (this_00 !=
        *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          **)local_c8.object._M_b._M_p) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_00,
                 *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   **)local_c8.object._M_b._M_p);
    }
    local_60.object._M_b._M_p = (__base_type)operator_new(0x10);
    (((__pointer_type)local_60.object._M_b._M_p)->ptr)._M_b._M_p = (__pointer_type)this_00;
    (((__pointer_type)local_60.object._M_b._M_p)->refCount).super___atomic_base<unsigned_long>._M_i
         = 1;
    local_60.lock.super___mutex_base._M_mutex._16_8_ = 0;
    local_60.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_60.lock.super___mutex_base._M_mutex.__align = 0;
    local_60.lock.super___mutex_base._M_mutex._8_8_ = 0;
    local_60.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    pLVar7 = MapWrapper::addItem((((__pointer_type)local_60.object._M_b._M_p)->ptr)._M_b._M_p,
                                 lat_name);
    LOCK();
    pHVar2 = (pLVar7->hist).bins + uVar5;
    (pHVar2->super___atomic_base<unsigned_long>)._M_i =
         (pHVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    LOCK();
    paVar1 = &(pLVar7->hist).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    LOCK();
    paVar1 = &(pLVar7->hist).sum;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + lat_value;
    UNLOCK();
    lVar8 = 3;
    do {
      if (lat_value <= (pLVar7->hist).max.super___atomic_base<unsigned_long>._M_i) break;
      (pLVar7->hist).max.super___atomic_base<unsigned_long>._M_i = lat_value;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    local_f8.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_f8.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_f8.lock.super___mutex_base._M_mutex._8_8_ = 0;
    local_f8.lock.super___mutex_base._M_mutex._16_8_ = 0;
    local_f8.object._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_f8.lock.super___mutex_base._M_mutex.__align = 0;
    ashared_ptr<MapWrapper>::operator=(&local_f8,&local_c8);
    local_98.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_98.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_98.lock.super___mutex_base._M_mutex._8_8_ = 0;
    local_98.lock.super___mutex_base._M_mutex._16_8_ = 0;
    local_98.object._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_98.lock.super___mutex_base._M_mutex.__align = 0;
    ashared_ptr<MapWrapper>::operator=(&local_98,&local_60);
    bVar4 = ashared_ptr<MapWrapper>::compare_exchange(&this->latestMap,&local_f8,&local_98);
    ashared_ptr<MapWrapper>::reset(&local_98);
    if (!bVar4) {
      MapWrapper::delItem((MapWrapper *)this_00,lat_name);
    }
    ashared_ptr<MapWrapper>::reset(&local_f8);
    ashared_ptr<MapWrapper>::reset(&local_60);
    bVar10 = lVar9 == 0;
    lVar9 = lVar9 + -1;
    if (bVar4 || bVar10) goto LAB_00103262;
  }
  if (lat_value == 0) {
    uVar5 = 0x40;
  }
  else {
    uVar5 = 0x3f;
    if (lat_value != 0) {
      for (; lat_value >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  LOCK();
  plVar3 = (long *)(*(long *)(lVar8 + 0x30) + uVar5 * 8);
  *plVar3 = *plVar3 + 1;
  UNLOCK();
  LOCK();
  *(long *)(lVar8 + 0x38) = *(long *)(lVar8 + 0x38) + 1;
  UNLOCK();
  LOCK();
  *(long *)(lVar8 + 0x40) = *(long *)(lVar8 + 0x40) + lat_value;
  UNLOCK();
  lVar9 = 3;
  do {
    if (lat_value <= *(ulong *)(lVar8 + 0x48)) break;
    *(uint64_t *)(lVar8 + 0x48) = lat_value;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
LAB_00103262:
  ashared_ptr<MapWrapper>::reset(&local_c8);
  return;
}

Assistant:

void addLatency(const std::string& lat_name, uint64_t lat_value) {
        MapWrapperSP cur_map = nullptr;

        size_t ticks_allowed = MAX_ADD_NEW_ITEM_RETRIES;
        do {
            cur_map = latestMap;
            LatencyItem *item = cur_map->get(lat_name);
            if (item) {
                // Found existing latency.
                item->addLatency(lat_value);
                return;
            }

            // Not found,
            // 1) Create a new map containing new stat in an MVCC manner, and
            // 2) Replace 'latestMap' pointer atomically.

            // Note:
            // Below insertion process happens only when a new stat item
            // is added. Generally the number of stats is not pretty big (<100),
            // and adding new stats will be finished at the very early stage.
            // Once all stats are populated in the map, below codes will never
            // be called, and adding new latency will be done without blocking
            // anything.

            // Copy from the current map.
            MapWrapper* new_map_raw = new MapWrapper();
            new_map_raw->copyFrom(*cur_map);
            MapWrapperSP new_map = MapWrapperSP(new_map_raw);

            // Add a new item.
            item = new_map->addItem(lat_name);
            item->addLatency(lat_value);

            // Atomic CAS, from current map to new map
            MapWrapperSP expected = cur_map;
            if (latestMap.compare_exchange(expected, new_map)) {
                // Succeeded.
                return;
            }

            // Failed, other thread updated the map at the same time.
            // Delete newly added item.
            new_map_raw->delItem(lat_name);
            // Retry.
        } while (ticks_allowed--);

        // Update failed, ignore the given latency at this time.
    }